

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.h
# Opt level: O2

string * __thiscall Type::surroundName(string *__return_storage_ptr__,Type *this,string *name)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string surroundName(const std::string& name) {
        return name;
    }